

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arena.h
# Opt level: O1

Program_FunctionsEntry_DoNotUse *
google::protobuf::Arena::
CreateMessageInternal<CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse>(Arena *arena)

{
  Program_FunctionsEntry_DoNotUse *this;
  
  if (arena == (Arena *)0x0) {
    this = (Program_FunctionsEntry_DoNotUse *)operator_new(0x28);
    CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse::Program_FunctionsEntry_DoNotUse
              (this,(Arena *)0x0);
  }
  else {
    this = (Program_FunctionsEntry_DoNotUse *)
           AllocateAlignedWithHook
                     (arena,0x28,
                      (type_info *)
                      &CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse::typeinfo);
    CoreML::Specification::MILSpec::Program_FunctionsEntry_DoNotUse::Program_FunctionsEntry_DoNotUse
              (this,arena);
  }
  return this;
}

Assistant:

PROTOBUF_NDEBUG_INLINE static T* CreateMessageInternal(Arena* arena) {
    static_assert(
        InternalHelper<T>::is_arena_constructable::value,
        "CreateMessage can only construct types that are ArenaConstructable");
    if (arena == NULL) {
      // Generated arena constructor T(Arena*) is protected. Call via
      // InternalHelper.
      return InternalHelper<T>::New();
    } else {
      return arena->DoCreateMessage<T>();
    }
  }